

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

string * StringBuilder<char[7],std::__cxx11::string&>
                   (char (*arg) [7],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string *in_RDI;
  string *arg_00;
  string local_58 [16];
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  arg_00 = in_RDI;
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffffb8);
  StringBuilder(arg_00);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}